

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<Strider*,long,int,int,int,int,float,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>
          (argument_loader<Strider*,long,int,int,int,int,float,float,bool> *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  handle hVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  reference rVar12;
  undefined8 local_40;
  bool local_38;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x28),hVar1,(*rVar12._M_p & rVar12._M_mask) != 0
                    );
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar4 = type_caster<long,_void>::load
                    ((type_caster<long,_void> *)(this + 0x20),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  bVar5 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x18),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
  bVar6 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x14),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
  bVar7 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x10),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x28);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,5);
  bVar8 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0xc),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x30);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,6);
  bVar9 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 8),hVar1,
                     (*rVar12._M_p & rVar12._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x38);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,7);
  bVar10 = type_caster<float,_void>::load
                     ((type_caster<float,_void> *)(this + 4),hVar1,
                      (*rVar12._M_p & rVar12._M_mask) != 0);
  local_40 = CONCAT26(CONCAT11(bVar10,bVar9),
                      CONCAT24(CONCAT11(bVar8,bVar7),
                               CONCAT13(bVar6,CONCAT12(bVar5,CONCAT11(bVar4,bVar3)))));
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x40);
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,8);
  local_38 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)this,hVar1,(*rVar12._M_p & rVar12._M_mask) != 0);
  lVar2 = 0;
  do {
    lVar11 = lVar2;
    if (lVar11 == 9) break;
    lVar2 = lVar11 + 1;
  } while (*(char *)((long)&local_40 + lVar11) != '\0');
  return lVar11 == 9;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }